

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Train::getPosibleCollisions(Train *this,MoveModel *move)

{
  __normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  __first;
  bool bVar1;
  int iVar2;
  int iVar3;
  SpeedType SVar4;
  Point *pPVar5;
  Point *pPVar6;
  reference ppLVar7;
  reference ppTVar8;
  MoveModel *in_RDX;
  Train *in_RSI;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *in_RDI;
  Train *train_3;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range3_2;
  Train *train_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range3_1;
  Train *train_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range4;
  Line *edg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range3;
  Point *point;
  Train *train;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range2;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> edges;
  Line *lin;
  int pos;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *res;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 uVar9;
  DispatchAction in_stack_fffffffffffffbbc;
  World *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  __normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  Level in_stack_fffffffffffffbdc;
  Writer *in_stack_fffffffffffffbe0;
  VerboseLevel in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
  *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  int local_3ac;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_310;
  undefined1 local_308 [24];
  undefined1 *local_2f0;
  Train *local_2e8;
  Train **local_2e0;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_2d8 [3];
  Train *this_00;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_2a0;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_298;
  Line *local_290;
  Line **local_288;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_280;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_278;
  Point *local_270;
  Train *local_268;
  Train **local_260;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_258;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_250;
  undefined1 local_241;
  Writer local_240;
  Writer local_1d0;
  int local_15c;
  Writer local_158;
  Line **local_e8;
  Line *local_e0;
  Line **local_d8;
  Line **local_d0;
  Line **local_c8;
  Writer local_98;
  Line *local_28;
  int local_1c;
  MoveModel *local_18;
  
  local_1c = in_RSI->position;
  local_28 = in_RSI->line;
  if (in_RDX != (MoveModel *)0x0) {
    local_18 = in_RDX;
    iVar2 = models::MoveModel::getLineIdx(in_RDX);
    iVar3 = Line::getIdx(local_28);
    if (iVar2 != iVar3) {
      pPVar5 = getPoint((Train *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      if (pPVar5 == (Point *)0x0) {
        uVar9 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                   (char *)in_stack_fffffffffffffbd0._M_current,
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   (char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                   in_stack_fffffffffffffbf0);
        el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  ((Writer *)in_stack_fffffffffffffbc0,
                   (char (*) [34])CONCAT44(in_stack_fffffffffffffbbc,uVar9));
        el::base::Writer::~Writer((Writer *)in_stack_fffffffffffffbc0);
        memset(in_RDI,0,0x18);
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                *)0x23b3b5);
        return in_RDI;
      }
      getPoint((Train *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      Point::getEdges((Point *)0x23b3f5);
      std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::
      vector(in_stack_fffffffffffffc10,
             (vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      local_d0 = (Line **)std::
                          vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                          ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                   *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_d8 = (Line **)std::
                          vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                          ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      models::MoveModel::getLineIdx(local_18);
      local_e0 = World::getLineByIdx(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
      __first._M_current._4_4_ = in_stack_fffffffffffffbdc;
      __first._M_current._0_4_ = in_stack_fffffffffffffbd8;
      local_c8 = (Line **)std::
                          find<__gnu_cxx::__normal_iterator<tiger::trains::world::Line**,std::vector<tiger::trains::world::Line*,std::allocator<tiger::trains::world::Line*>>>,tiger::trains::world::Line*>
                                    (__first,in_stack_fffffffffffffbd0,
                                     (Line **)CONCAT44(in_stack_fffffffffffffbcc,
                                                       in_stack_fffffffffffffbc8));
      local_e8 = (Line **)std::
                          vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                          ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                          *)in_stack_fffffffffffffbc0,
                         (__normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      if (bVar1) {
        in_stack_fffffffffffffbb8 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                   (char *)in_stack_fffffffffffffbd0._M_current,
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   (char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                   in_stack_fffffffffffffbf0);
        el::base::Writer::construct(&local_158,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  ((Writer *)in_stack_fffffffffffffbc0,
                   (char (*) [34])CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        el::base::Writer::~Writer((Writer *)in_stack_fffffffffffffbc0);
        memset(in_RDI,0,0x18);
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                *)0x23b59b);
        local_15c = 1;
      }
      else {
        models::MoveModel::getLineIdx(local_18);
        local_28 = World::getLineByIdx(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
        pPVar5 = Line::getStartPont(local_28);
        pPVar6 = getPoint((Train *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        if (pPVar5 == pPVar6) {
          local_3ac = 0;
        }
        else {
          local_3ac = Line::getLenght(local_28);
        }
        local_1c = local_3ac;
        local_15c = 0;
      }
      std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::
      ~vector((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *
              )in_stack_fffffffffffffbd0._M_current);
      if (local_15c != 0) {
        return in_RDI;
      }
    }
    SVar4 = models::MoveModel::getSpeedType(local_18);
    iVar2 = local_1c;
    if (SVar4 == FORWARD) {
      iVar3 = Line::getLenght(local_28);
      if (iVar2 == iVar3) {
        uVar9 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                   (char *)in_stack_fffffffffffffbd0._M_current,
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   (char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                   in_stack_fffffffffffffbf0);
        el::base::Writer::construct(&local_1d0,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  ((Writer *)in_stack_fffffffffffffbc0,
                   (char (*) [34])CONCAT44(in_stack_fffffffffffffbbc,uVar9));
        el::base::Writer::~Writer((Writer *)in_stack_fffffffffffffbc0);
        memset(in_RDI,0,0x18);
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                *)0x23b7e9);
        return in_RDI;
      }
      local_1c = local_1c + 1;
    }
    SVar4 = models::MoveModel::getSpeedType(local_18);
    if (SVar4 == REVERSE) {
      if (local_1c == 0) {
        uVar9 = 0;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                   (char *)in_stack_fffffffffffffbd0._M_current,
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   (char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                   in_stack_fffffffffffffbf0);
        el::base::Writer::construct(&local_240,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  ((Writer *)in_stack_fffffffffffffbc0,
                   (char (*) [34])CONCAT44(in_stack_fffffffffffffbbc,uVar9));
        el::base::Writer::~Writer((Writer *)in_stack_fffffffffffffbc0);
        memset(in_RDI,0,0x18);
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                *)0x23b8e2);
        return in_RDI;
      }
      local_1c = local_1c + -1;
    }
  }
  local_241 = 0;
  std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::vector
            ((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)0x23b935);
  local_250 = Line::getTrains((Line *)0x23b946);
  local_258._M_current =
       (Train **)
       std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
       begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_260 = (Train **)
              std::
              vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              ::end((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                     *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)in_stack_fffffffffffffbc0,
                            (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)), bVar1
        ) {
    ppTVar8 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
              ::operator*(&local_258);
    local_268 = *ppTVar8;
    if (local_268 != in_RSI) {
      in_stack_fffffffffffffc1c = local_1c;
      iVar2 = getPosition(local_268);
      iVar2 = in_stack_fffffffffffffc1c - iVar2;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 2) {
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                   *)in_stack_fffffffffffffbd0._M_current,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      }
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator++(&local_258);
  }
  local_270 = (Point *)0x0;
  if (local_1c == 0) {
    local_270 = Line::getStartPont(local_28);
  }
  iVar2 = local_1c;
  iVar3 = Line::getLenght(local_28);
  if (iVar2 == iVar3) {
    local_270 = Line::getStartPont(local_28);
  }
  if (local_270 != (Point *)0x0) {
    local_278 = Point::getEdges((Point *)0x23bae1);
    local_280._M_current =
         (Line **)std::
                  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                           *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_288 = (Line **)std::
                         vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                         ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)in_stack_fffffffffffffbc0,
                              (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar1) {
      ppLVar7 = __gnu_cxx::
                __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                ::operator*(&local_280);
      local_290 = *ppLVar7;
      local_298 = Line::getTrains((Line *)0x23bb62);
      local_2a0._M_current =
           (Train **)
           std::
           vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
           begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      end((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *)
          CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                                 *)in_stack_fffffffffffffbc0,
                                (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
            bVar1) {
        ppTVar8 = __gnu_cxx::
                  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                  ::operator*(&local_2a0);
        this_00 = *ppTVar8;
        pPVar5 = Line::getStartPont(local_290);
        if ((pPVar5 == local_270) && (iVar2 = getPosition(this_00), iVar2 < 2)) {
          std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
          ::push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                       *)in_stack_fffffffffffffbd0._M_current,
                      (value_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        }
        pPVar5 = Line::getEndPont(local_290);
        if (pPVar5 == local_270) {
          iVar2 = getPosition(this_00);
          iVar3 = Line::getLenght(local_290);
          if (iVar3 + -2 < iVar2) {
            std::
            vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
            push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                       *)in_stack_fffffffffffffbd0._M_current,
                      (value_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          }
        }
        __gnu_cxx::
        __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
        ::operator++(&local_2a0);
      }
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
      ::operator++(&local_280);
    }
  }
  if (local_1c < 2) {
    in_stack_fffffffffffffbd0._M_current = (Line **)Line::getStartPont(local_28);
    Point::getTrains((Point *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    local_2d8[0]._M_current =
         (Train **)
         std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
         ::begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_2e0 = (Train **)
                std::
                vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                ::end((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                       *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                               *)in_stack_fffffffffffffbc0,
                              (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar1) {
      ppTVar8 = __gnu_cxx::
                __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                ::operator*(local_2d8);
      local_2e8 = *ppTVar8;
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 *)in_stack_fffffffffffffbd0._M_current,
                (value_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
      ::operator++(local_2d8);
    }
    local_15c = 8;
    std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
    ~vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *
            )in_stack_fffffffffffffbd0._M_current);
  }
  iVar2 = local_1c;
  iVar3 = Line::getLenght(local_28);
  if (iVar3 + -2 < iVar2) {
    pPVar5 = Line::getEndPont(local_28);
    Point::getTrains((Point *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    local_2f0 = local_308;
    local_310._M_current =
         (Train **)
         std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
         ::begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::end
              ((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                               *)pPVar5,
                              (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
      ::operator*(&local_310);
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 *)in_stack_fffffffffffffbd0._M_current,(value_type *)CONCAT44(iVar3,iVar2));
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
      ::operator++(&local_310);
    }
    local_15c = 10;
    std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
    ~vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *
            )in_stack_fffffffffffffbd0._M_current);
  }
  return in_RDI;
}

Assistant:

std::vector<Train *> Train::getPosibleCollisions(const models::MoveModel *move)
{
    int pos = position;
    const Line *lin = line;


    if (move!=nullptr)
    {
        if (move->getLineIdx() != lin->getIdx())
        {

            if (getPoint() == nullptr)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            std::vector<Line *> edges = getPoint()->getEdges();

            if (std::find(edges.begin(), edges.end(), owner->getLineByIdx(move->getLineIdx())) == edges.end())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            lin = owner->getLineByIdx(move->getLineIdx());
            pos = lin->getStartPont() == getPoint() ? 0 : lin->getLenght();
        }

        if (move->getSpeedType() == models::SpeedType::FORWARD)
        {
            if (pos == lin->getLenght())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos++;
        }

        if (move->getSpeedType() == models::SpeedType::REVERSE)
        {
            if (pos == 0)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos--;
        }
    }

    std::vector<Train *> res;

    for (Train *train : line->getTrains())
        if (train != this)
        {
            if (abs(pos - train->getPosition()) < 2)
                res.push_back(train);
        }

    Point *point = nullptr;

    if (pos == 0)
        point = lin->getStartPont();

    if (pos == lin->getLenght())
        point = lin->getStartPont();

    if (point)
        for (Line *edg: point->getEdges())
            for (Train *train : edg->getTrains())
            {
                if (edg->getStartPont() == point && train->getPosition() < 2)
                    res.push_back(train);

                if (edg->getEndPont() == point && train->getPosition() > edg->getLenght() - 2)
                    res.push_back(train);
            }

    if (pos < 2)
        for (Train *train : lin->getStartPont()->getTrains())
            res.push_back(train);

    if (pos > lin->getLenght() - 2)
        for (Train *train : lin->getEndPont()->getTrains())
            res.push_back(train);

    return res;
}